

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O1

void __thiscall
webfront::log::debug<int,_int,_int,_int,_unsigned_long,_unsigned_long>::debug
          (debug<int,_int,_int,_int,_unsigned_long,_unsigned_long> *this,string_view fmt,int *ts,
          int *ts_1,int *ts_2,int *ts_3,unsigned_long *ts_4,unsigned_long *ts_5,srcLoc *l)

{
  double __x;
  string local_30;
  
  if (logTypeEnabled._4_1_ == '\x01') {
    std::format<int,int,int,int,unsigned_long,unsigned_long>
              (&local_30,fmt,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
    anon_unknown_4::log(__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

debug(string_view fmt, Ts&&... ts, const srcLoc& l = srcLoc::current()) {
    if (is(Debug)) log(Debug, fmt, l, std::forward<Ts>(ts)...);
    }